

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# row_common.cc
# Opt level: O3

void MergeRGBRow_C(uint8_t *src_r,uint8_t *src_g,uint8_t *src_b,uint8_t *dst_rgb,int width)

{
  ulong uVar1;
  
  if (0 < width) {
    uVar1 = 0;
    do {
      *dst_rgb = src_r[uVar1];
      dst_rgb[1] = src_g[uVar1];
      dst_rgb[2] = src_b[uVar1];
      dst_rgb = dst_rgb + 3;
      uVar1 = uVar1 + 1;
    } while ((uint)width != uVar1);
  }
  return;
}

Assistant:

void MergeRGBRow_C(const uint8_t* src_r,
                   const uint8_t* src_g,
                   const uint8_t* src_b,
                   uint8_t* dst_rgb,
                   int width) {
  int x;
  for (x = 0; x < width; ++x) {
    dst_rgb[0] = src_r[x];
    dst_rgb[1] = src_g[x];
    dst_rgb[2] = src_b[x];
    dst_rgb += 3;
  }
}